

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  pointer pcVar2;
  long lVar3;
  string sVar4;
  char cVar5;
  char *pcVar6;
  const_iterator cVar7;
  size_t sVar8;
  ostream *poVar9;
  long *plVar10;
  runtime_error *this;
  ulong uVar11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  string *rootURL;
  long lVar13;
  _Elt_pointer ppVar14;
  bool bVar15;
  error_code ec;
  type filePath;
  error_code systemError;
  CURLSession session;
  deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> paths;
  time_t uploadTime;
  Configuration cfg;
  options_description desc;
  variables_map vm;
  path local_2f8;
  float local_2d4;
  path local_2d0;
  CURLSession local_2b0;
  undefined1 local_2a0 [32];
  _Elt_pointer local_280;
  _Map_pointer local_278;
  _Elt_pointer local_270;
  _Elt_pointer local_268;
  _Map_pointer local_258;
  time_t local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  size_type local_218;
  string local_200;
  string local_1e0;
  ulong local_1c0;
  ulong local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  path local_198;
  long *local_178 [2];
  long local_168 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  long local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60 [48];
  
  curl_global_init(3);
  local_248._0_8_ = (pointer)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)local_248,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_248._0_8_ != (pointer)local_238) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
  }
  local_248._0_8_ = boost::program_options::options_description::add_options();
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_248,"help");
  boost::program_options::options_description_easy_init::operator()(pcVar6,"verbose,v");
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  local_f8.super_function_base.vtable = (vtable_base *)0x0;
  local_f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_f8.super_function_base.functor._8_8_ = 0;
  local_f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_248,argc,argv,(options_description *)local_178,0,
             &local_f8);
  boost::program_options::store((basic_parsed_options *)local_248,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_248);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_f8);
  local_248._0_8_ = (pointer)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"help","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_248);
  if ((pointer)local_248._0_8_ != (pointer)local_238) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
  }
  if (cVar7._M_node != &local_b8) {
    pcVar6 = *argv;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13a128);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar9 = (ostream *)std::ostream::flush();
    plVar10 = (long *)boost::program_options::operator<<(poVar9,(options_description *)local_178);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    local_d0[0] = __gmon_start__;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::~_Rb_tree(local_c0);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_110);
    if (local_138 != (void *)0x0) {
      operator_delete(local_138,local_118 - (long)local_138);
      local_138 = (void *)0x0;
      local_130 = 0;
      local_128 = 0;
      local_120 = 0;
      local_118 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_150);
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    return 0;
  }
  boost::program_options::notify((variables_map *)local_d0);
  Configuration::Configuration((Configuration *)local_248);
  pcVar2 = local_2a0 + 0x10;
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"verbose","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_2a0);
  if (cVar7._M_node == &local_b8) {
    sVar4 = local_248[0];
    if ((pointer)local_2a0._0_8_ != pcVar2) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if (sVar4 == (string)0x0) goto LAB_001192aa;
  }
  else if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_248[1] = true;
LAB_001192aa:
  if (local_218 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Base dir cannot be empty");
  }
  else if ((pointer)local_238._0_8_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Base URL cannot be empty");
  }
  else if ((local_200._M_string_length == 0) || (local_1e0._M_string_length != 0)) {
    if (local_1c0 == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Segment duration not specified");
    }
    else if (local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Extensions list cannot be empty");
    }
    else {
      local_2a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_238._24_8_,(char *)(local_238._24_8_ + local_218));
      boost::filesystem::detail::status(&local_198,(error_code *)local_2a0);
      bVar15 = true;
      if (1 < (uint)local_198.m_pathname._M_dataplus._M_p) {
        local_198.m_pathname._M_dataplus._M_p = (pointer)&local_198.m_pathname.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_238._24_8_,(char *)(local_238._24_8_ + local_218));
        boost::filesystem::detail::status(&local_2f8,(error_code *)&local_198);
        bVar15 = (int)local_2f8.m_pathname._M_dataplus._M_p != 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.m_pathname._M_dataplus._M_p != &local_198.m_pathname.field_2) {
          operator_delete(local_198.m_pathname._M_dataplus._M_p,
                          local_198.m_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_2a0._0_8_ != pcVar2) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      if (!bVar15) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Camera streamer is running",0x1a);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        if ((bool)local_248[1] == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"* Base directory:      ",0x17);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_238._24_8_,local_218);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"* Base URL:            ",0x17);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_248._8_8_,local_238._0_8_);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"* Backlog duration:    ",0x17);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        CURLSession::CURLSession(&local_2b0);
        CURLSession::set_verbose(&local_2b0,(bool)local_248[0]);
        if ((local_200._M_string_length != 0) && (local_1e0._M_string_length != 0)) {
          CURLSession::set_credentials(&local_2b0,&local_200,&local_1e0);
        }
        do {
          local_2f8.m_pathname._M_dataplus._M_p = (pointer)&local_2f8.m_pathname.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_238._24_8_,(char *)(local_238._24_8_ + local_218));
          find_upload_files((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                             *)local_2a0,&local_2f8,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) {
            operator_delete(local_2f8.m_pathname._M_dataplus._M_p,
                            local_2f8.m_pathname.field_2._M_allocated_capacity + 1);
          }
          if (local_270 == (_Elt_pointer)local_2a0._16_8_) {
            local_2f8.m_pathname._M_dataplus._M_p = (pointer)0xc8;
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&local_2f8);
          }
          else {
            uVar11 = local_1b8 / local_1c0;
            if (local_1c0 <= local_1b8) {
              while (uVar11 < ((long)local_280 - local_2a0._16_8_ >> 5) +
                              ((long)local_270 - (long)local_268 >> 5) +
                              ((((ulong)((long)local_258 - (long)local_278) >> 3) - 1) +
                              (ulong)(local_258 == (_Map_pointer)0x0)) * 0x10) {
                ppVar14 = local_270;
                if (local_270 == local_268) {
                  ppVar14 = local_258[-1] + 0x10;
                }
                if ((bool)local_248[1] == true) {
                  boost::filesystem::path::filename();
                  pbVar12 = boost::filesystem::operator<<
                                      ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                       &local_2f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pbVar12,": Removing from backlog",0x17);
                  std::endl<char,std::char_traits<char>>(pbVar12);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) {
                    operator_delete(local_2f8.m_pathname._M_dataplus._M_p,
                                    local_2f8.m_pathname.field_2._M_allocated_capacity + 1);
                  }
                }
                boost::filesystem::detail::remove(ppVar14 + -1,(error_code *)0x0);
                std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                pop_back((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *
                         )local_2a0);
              }
            }
            lVar13 = local_1c0 * 1000000;
            lVar3 = lVar13 / 10;
            do {
              local_2f8.m_pathname._M_dataplus._M_p = (pointer)&local_2f8.m_pathname.field_2;
              psVar1 = (size_type *)(local_2a0._16_8_ + 0x10);
              if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)local_2a0._16_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2f8.m_pathname.field_2._M_allocated_capacity = *psVar1;
                local_2f8.m_pathname.field_2._8_8_ = *(long *)(local_2a0._16_8_ + 0x18);
              }
              else {
                local_2f8.m_pathname.field_2._M_allocated_capacity = *psVar1;
                local_2f8.m_pathname._M_dataplus._M_p =
                     (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                **)local_2a0._16_8_;
              }
              local_2f8.m_pathname._M_string_length = *(size_type *)(local_2a0._16_8_ + 8);
              *(size_type **)local_2a0._16_8_ = psVar1;
              *(long *)(local_2a0._16_8_ + 8) = 0;
              *(undefined1 *)(local_2a0._16_8_ + 0x10) = 0;
              std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
              pop_front((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                        local_2a0);
              uVar11 = boost::filesystem::detail::file_size(&local_2f8,(error_code *)0x0);
              local_250 = 0;
              if ((bool)local_248[1] == true) {
                boost::filesystem::path::filename();
                pbVar12 = boost::filesystem::operator<<
                                    ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     &local_2d0);
                std::__ostream_insert<char,std::char_traits<char>>(pbVar12,": Uploading... ",0xf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_2d0.m_pathname._M_dataplus._M_p._4_4_,
                                (int)local_2d0.m_pathname._M_dataplus._M_p) !=
                    &local_2d0.m_pathname.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_2d0.m_pathname._M_dataplus._M_p._4_4_,
                                           (int)local_2d0.m_pathname._M_dataplus._M_p),
                                  local_2d0.m_pathname.field_2._M_allocated_capacity + 1);
                }
                std::ostream::flush();
              }
              rootURL = (string *)(local_248 + 8);
              bVar15 = CURLSession::upload_file(&local_2b0,&local_2f8,uVar11,rootURL,&local_250);
              if (bVar15) {
                lVar13 = lVar13 - local_250;
                if ((bool)local_248[1] == true) {
                  local_2d4 = (float)local_250 / 1e+06;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Done. Transfer speed: ",0x16);
                  if ((long)uVar11 < 0) {
                    rootURL = (string *)((ulong)((uint)uVar11 & 1) | uVar11 >> 1);
                  }
                  poVar9 = std::ostream::_M_insert<double>
                                     ((double)(((float)uVar11 / local_2d4) * 0.0009765625));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," kB/s (",7);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes in ",10);
                  poVar9 = std::ostream::_M_insert<double>((double)local_2d4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," second(s))",0xb);
                  std::endl<char,std::char_traits<char>>(poVar9);
                  if (local_248[0] == (string)0x1) {
                    if (lVar13 <= lVar3) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "No enough time left for current window, refreshing upload file list"
                                 ,0x43);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    }
                    boost::filesystem::path::filename();
                    pbVar12 = boost::filesystem::operator<<
                                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                         &local_2d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (pbVar12,": Removing file from disk... ",0x1d);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_2d0.m_pathname._M_dataplus._M_p._4_4_,
                                    (int)local_2d0.m_pathname._M_dataplus._M_p) !=
                        &local_2d0.m_pathname.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_2d0.m_pathname._M_dataplus._M_p._4_4_,
                                               (int)local_2d0.m_pathname._M_dataplus._M_p),
                                      local_2d0.m_pathname.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                local_2d0.m_pathname._M_dataplus._M_p._0_4_ = 0;
                local_2d0.m_pathname._M_dataplus._M_p._4_4_ =
                     local_2d0.m_pathname._M_dataplus._M_p._4_4_ & 0xffffff00;
                local_2d0.m_pathname._M_string_length =
                     (size_type)boost::system::detail::cat_holder<void>::system_category_instance;
                cVar5 = boost::filesystem::detail::remove(&local_2f8,(error_code *)&local_2d0);
                if (cVar5 == '\0') {
                  if ((bool)local_248[1] == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Failed to remove uploaded file from disk (",
                               0x2a);
                    ec.cat_ = (error_category *)rootURL;
                    ec.val_ = (undefined4)local_2d0.m_pathname._M_string_length;
                    ec.failed_ = (bool)local_2d0.m_pathname._M_string_length._4_1_;
                    ec._5_3_ = local_2d0.m_pathname._M_string_length._5_3_;
                    pbVar12 = boost::system::operator<<
                                        ((system *)&std::cout,
                                         (basic_ostream<char,_std::char_traits<char>_> *)
                                         CONCAT44(local_2d0.m_pathname._M_dataplus._M_p._4_4_,
                                                  (int)local_2d0.m_pathname._M_dataplus._M_p),ec);
                    std::__ostream_insert<char,std::char_traits<char>>(pbVar12,")",1);
                    goto LAB_001199b4;
                  }
                }
                else if (local_248[0] == (string)0x1) {
                  pbVar12 = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done",4)
                  ;
LAB_001199b4:
                  std::endl<char,std::char_traits<char>>(pbVar12);
                }
              }
              else if (local_248[0] == (string)0x1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Failed to upload file, breaking from loop.",0x2a);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) {
                operator_delete(local_2f8.m_pathname._M_dataplus._M_p,
                                local_2f8.m_pathname.field_2._M_allocated_capacity + 1);
              }
            } while (((bVar15) && (local_270 != (_Elt_pointer)local_2a0._16_8_)) && (lVar3 < lVar13)
                    );
          }
          std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~deque
                    ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                     local_2a0);
        } while( true );
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Base directory doesn\'t exist or is not a directory");
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Username provided without a password");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv)
{
    curl_global_init(CURL_GLOBAL_ALL);

    po::options_description desc("Options");
    desc.add_options()
        ("help", "Print help messages")
        ("verbose,v", "Make output verbose");

    po::variables_map vm;

    try
    {
        po::store(po::parse_command_line(argc, argv, desc), vm);

        if (vm.count("help"))
        {
            std::cout << argv[0] << ":" << std::endl << desc << std::endl;
            return 0;
        }

        po::notify(vm);
    }
    catch (const po::error& e)
    {
        std::cerr << "Error: " << e.what() << std::endl << std::endl;
        std::cerr << desc << std::endl;
        return 1;
    }

    int exitResult = 0;

    try
    {
        Configuration cfg;

        if (vm.count("verbose") || cfg.debug())
        {
            cfg.verbose(true);
        }

        if (cfg.base_dir().empty())
        {
            throw std::runtime_error("Base dir cannot be empty");
        }

        if (cfg.base_url().empty())
        {
            throw std::runtime_error("Base URL cannot be empty");
        }

        if (!cfg.username().empty() && cfg.password().empty())
        {
            throw std::runtime_error("Username provided without a password");
        }

        if (!cfg.segment_duration())
        {
            throw std::runtime_error("Segment duration not specified");
        }

        if (cfg.extensions().empty())
        {
            throw std::runtime_error("Extensions list cannot be empty");
        }

        if (!fs::exists(cfg.base_dir()) || !fs::is_directory(cfg.base_dir()))
        {
            throw std::runtime_error("Base directory doesn't exist or is not a directory");
        }

        std::cout << "Camera streamer is running" << std::endl;

        if (cfg.verbose())
        {
            std::cout << "* Base directory:      " << cfg.base_dir() << std::endl;
            std::cout << "* Base URL:            " << cfg.base_url() << std::endl;
            std::cout << "* Backlog duration:    " << cfg.max_backlog_total_segment_duration() << std::endl;
        }

        CURLSession session;

        // Enabling this will dump HTTP traffic to stdout
        session.set_verbose(cfg.debug());

        if (!cfg.username().empty() && !cfg.password().empty())
        {
            session.set_credentials(cfg.username(), cfg.password());
        }

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"

        while (true)
        {
            // First, look for files to upload
            auto paths = find_upload_files(cfg.base_dir(), cfg.extensions());

            if (paths.empty())
            {
                // If we didn't find any files, just sleep a bit and try again later
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                continue;
            }

            // We've found some files to upload.
            // First, we check a backlog - we'll calculate how many items do we have stored in storage, queued for sending
            // and if it's duration will exceed given threshold, we'll just delete them from filesystem. This algorithm
            // will ensure that once we're not ready for sending for a long period of time, we won't go out of storage
            // space. Default for backlog duration is 300 seconds, that is 5 minutes of video - can be changed by
            // environment variable.
            auto maxBacklogItems = cfg.max_backlog_total_segment_duration() / cfg.segment_duration();

            if (maxBacklogItems > 0)
            {
                while (paths.size() > maxBacklogItems)
                {
                    // Since order is from newest to oldest, pop items from the back - the oldest ones.
                    const auto& path = paths.back();

                    if (cfg.verbose())
                    {
                        std::cout << path.filename() << ": Removing from backlog" << std::endl;
                    }

                    fs::remove(path);

                    paths.pop_back();
                }
            }

            // Now it's time for file upload. Since we know for sure segment's duration, we can estimate how much
            // files from the backlog we can send until new segment arrives. In order to do that we'll keep track of
            // the time that we spent on each individual file, starting with a time pool equals to one segment duration
            // (in microseconds). After each upload, we'll subtract spent time from available time. Once available
            // time is negative, it means we need to refresh our upload file list. Minimal threshold for available
            // time is 10% of initial available time - we don't want to start sending next piece just before remaining
            // time is about to end.
            time_t availableUploadTime = cfg.segment_duration() * 1000000;
            time_t uploadTimeThreshold = availableUploadTime / 10;

            do
            {
                auto filePath = std::move(paths.front());
                paths.pop_front();

                auto fileSize = fs::file_size(filePath);
                time_t uploadTime = 0;

                if (cfg.verbose())
                {
                    std::cout << filePath.filename() << ": Uploading... ";
                    std::cout.flush();
                }

                if (!session.upload_file(filePath, fileSize, cfg.base_url(), uploadTime))
                {
                    if (cfg.debug())
                    {
                        std::cout << "Failed to upload file, breaking from loop." << std::endl;
                    }

                    break;
                }

                // Update time frame we have for uploading files from backlog.
                availableUploadTime -= uploadTime;

                if (cfg.verbose())
                {
                    auto elapsed = uploadTime / 1000000.0f;
                    auto transferSpeed = fileSize / elapsed / 1024.0f;

                    std::cout << "Done. Transfer speed: " << transferSpeed << " kB/s (" << fileSize << " bytes in " << elapsed << " second(s))" << std::endl;

                    if (cfg.debug())
                    {
                        if (availableUploadTime <= uploadTimeThreshold)
                        {
                            std::cout << "No enough time left for current window, refreshing upload file list" << std::endl;
                        }

                        std::cout << filePath.filename() << ": Removing file from disk... ";
                    }
                }

                // Since we've uploaded file to the server, we don't need it any more in the filesystem.
                boost::system::error_code systemError;
                if (!fs::remove(filePath, systemError))
                {
                    if (cfg.verbose())
                    {
                        std::cout << "Failed to remove uploaded file from disk (" << systemError << ")" << std::endl;
                    }
                }
                else
                {
                    if (cfg.debug())
                    {
                        std::cout << "Done" << std::endl;
                    }
                }

                // We'll continue looping until there are files in the backlog and we still have some time left.
            } while (!paths.empty() && availableUploadTime > uploadTimeThreshold);
        }

#pragma clang diagnostic pop

    }
    catch (const std::exception& ex)
    {
        std::cerr << "Exception: " << ex.what() << std::endl;
        exitResult = 1;
    }

    curl_global_cleanup();
    return exitResult;
}